

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boing.c
# Opt level: O0

void DrawBoingBallBand(GLfloat long_lo,GLfloat long_hi)

{
  vertex_t c;
  vertex_t b;
  vertex_t a;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  float local_50;
  undefined1 local_4c [4];
  GLfloat lat_deg;
  vertex_t vert_norm;
  vertex_t vert_se;
  vertex_t vert_sw;
  vertex_t vert_nw;
  vertex_t vert_ne;
  GLfloat long_hi_local;
  GLfloat long_lo_local;
  
  for (local_50 = 0.0; local_50 <= 337.5; local_50 = local_50 + 22.5) {
    if (DrawBoingBallBand::colorToggle == 0) {
      (*glad_glColor3f)(0.95,0.95,0.95);
    }
    else {
      (*glad_glColor3f)(0.8,0.1,0.1);
    }
    DrawBoingBallBand::colorToggle = (int)((DrawBoingBallBand::colorToggle != 0 ^ 0xffU) & 1);
    if (drawBallHow == DRAW_BALL_SHADOW) {
      (*glad_glColor3f)(0.35,0.35,0.35);
    }
    dVar9 = cos_deg((double)long_hi);
    fVar1 = (float)dVar9 * 70.0;
    dVar9 = cos_deg((double)long_lo);
    fVar2 = (float)dVar9 * 70.0;
    vert_norm.z = fVar2;
    dVar9 = cos_deg((double)local_50);
    dVar10 = sin_deg((double)(long_lo + 22.5));
    fVar3 = (float)dVar9 * (float)dVar10 * 70.0;
    dVar9 = cos_deg((double)local_50);
    dVar10 = sin_deg((double)long_lo);
    vert_norm.y = (float)dVar9 * (float)dVar10 * 70.0;
    dVar9 = cos_deg((double)(local_50 + 22.5));
    dVar10 = sin_deg((double)(long_lo + 22.5));
    fVar4 = (float)dVar9 * (float)dVar10 * 70.0;
    dVar9 = cos_deg((double)(local_50 + 22.5));
    dVar10 = sin_deg((double)long_lo);
    fVar5 = (float)dVar9 * (float)dVar10 * 70.0;
    dVar9 = sin_deg((double)local_50);
    dVar10 = sin_deg((double)(long_lo + 22.5));
    fVar6 = (float)dVar9 * (float)dVar10 * 70.0;
    dVar9 = sin_deg((double)local_50);
    dVar10 = sin_deg((double)long_lo);
    dVar11 = sin_deg((double)(local_50 + 22.5));
    dVar12 = sin_deg((double)(long_lo + 22.5));
    fVar7 = (float)dVar11 * (float)dVar12 * 70.0;
    dVar11 = sin_deg((double)(local_50 + 22.5));
    dVar12 = sin_deg((double)long_lo);
    fVar8 = (float)dVar11 * (float)dVar12 * 70.0;
    (*glad_glBegin)(9);
    a.y = fVar1;
    a.x = fVar3;
    a.z = fVar6;
    b.y = fVar1;
    b.x = fVar4;
    b.z = fVar7;
    c.y = fVar2;
    c.x = fVar5;
    c.z = fVar8;
    CrossProduct(a,b,c,(vertex_t *)local_4c);
    (*glad_glNormal3f)((GLfloat)local_4c,lat_deg,vert_norm.x);
    (*glad_glVertex3f)(fVar3,fVar1,fVar6);
    (*glad_glVertex3f)(fVar4,fVar1,fVar7);
    (*glad_glVertex3f)(fVar5,fVar2,fVar8);
    (*glad_glVertex3f)(vert_norm.y,vert_norm.z,(float)dVar9 * (float)dVar10 * 70.0);
    (*glad_glEnd)();
  }
  DrawBoingBallBand::colorToggle = (uint)((DrawBoingBallBand::colorToggle != 0 ^ 0xffU) & 1);
  return;
}

Assistant:

void DrawBoingBallBand( GLfloat long_lo,
                        GLfloat long_hi )
{
   vertex_t vert_ne;            /* "ne" means south-east, so on */
   vertex_t vert_nw;
   vertex_t vert_sw;
   vertex_t vert_se;
   vertex_t vert_norm;
   GLfloat  lat_deg;
   static int colorToggle = 0;

  /*
   * Iterate through the points of a latitude circle.
   * A latitude circle is a 2D set of X,Z points.
   */
   for ( lat_deg = 0;
         lat_deg <= (360 - STEP_LATITUDE);
         lat_deg += STEP_LATITUDE )
   {
     /*
      * Color this polygon with red or white.
      */
      if ( colorToggle )
         glColor3f( 0.8f, 0.1f, 0.1f );
      else
         glColor3f( 0.95f, 0.95f, 0.95f );
#if 0
      if ( lat_deg >= 180 )
         if ( colorToggle )
            glColor3f( 0.1f, 0.8f, 0.1f );
         else
            glColor3f( 0.5f, 0.5f, 0.95f );
#endif
      colorToggle = ! colorToggle;

     /*
      * Change color if drawing shadow.
      */
      if ( drawBallHow == DRAW_BALL_SHADOW )
         glColor3f( 0.35f, 0.35f, 0.35f );

     /*
      * Assign each Y.
      */
      vert_ne.y = vert_nw.y = (float) cos_deg(long_hi) * RADIUS;
      vert_sw.y = vert_se.y = (float) cos_deg(long_lo) * RADIUS;

     /*
      * Assign each X,Z with sin,cos values scaled by latitude radius indexed by longitude.
      * Eg, long=0 and long=180 are at the poles, so zero scale is sin(longitude),
      * while long=90 (sin(90)=1) is at equator.
      */
      vert_ne.x = (float) cos_deg( lat_deg                 ) * (RADIUS * (float) sin_deg( long_lo + STEP_LONGITUDE ));
      vert_se.x = (float) cos_deg( lat_deg                 ) * (RADIUS * (float) sin_deg( long_lo                  ));
      vert_nw.x = (float) cos_deg( lat_deg + STEP_LATITUDE ) * (RADIUS * (float) sin_deg( long_lo + STEP_LONGITUDE ));
      vert_sw.x = (float) cos_deg( lat_deg + STEP_LATITUDE ) * (RADIUS * (float) sin_deg( long_lo                  ));

      vert_ne.z = (float) sin_deg( lat_deg                 ) * (RADIUS * (float) sin_deg( long_lo + STEP_LONGITUDE ));
      vert_se.z = (float) sin_deg( lat_deg                 ) * (RADIUS * (float) sin_deg( long_lo                  ));
      vert_nw.z = (float) sin_deg( lat_deg + STEP_LATITUDE ) * (RADIUS * (float) sin_deg( long_lo + STEP_LONGITUDE ));
      vert_sw.z = (float) sin_deg( lat_deg + STEP_LATITUDE ) * (RADIUS * (float) sin_deg( long_lo                  ));

     /*
      * Draw the facet.
      */
      glBegin( GL_POLYGON );

      CrossProduct( vert_ne, vert_nw, vert_sw, &vert_norm );
      glNormal3f( vert_norm.x, vert_norm.y, vert_norm.z );

      glVertex3f( vert_ne.x, vert_ne.y, vert_ne.z );
      glVertex3f( vert_nw.x, vert_nw.y, vert_nw.z );
      glVertex3f( vert_sw.x, vert_sw.y, vert_sw.z );
      glVertex3f( vert_se.x, vert_se.y, vert_se.z );

      glEnd();

#if BOING_DEBUG
      printf( "----------------------------------------------------------- \n" );
      printf( "lat = %f  long_lo = %f  long_hi = %f \n", lat_deg, long_lo, long_hi );
      printf( "vert_ne  x = %.8f  y = %.8f  z = %.8f \n", vert_ne.x, vert_ne.y, vert_ne.z );
      printf( "vert_nw  x = %.8f  y = %.8f  z = %.8f \n", vert_nw.x, vert_nw.y, vert_nw.z );
      printf( "vert_se  x = %.8f  y = %.8f  z = %.8f \n", vert_se.x, vert_se.y, vert_se.z );
      printf( "vert_sw  x = %.8f  y = %.8f  z = %.8f \n", vert_sw.x, vert_sw.y, vert_sw.z );
#endif

   }

  /*
   * Toggle color so that next band will opposite red/white colors than this one.
   */
   colorToggle = ! colorToggle;

  /*
   * This circular band is done.
   */
   return;
}